

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

Bits testing::internal::FloatingPoint<double>::SignAndMagnitudeToBiased(Bits *sam)

{
  Bits *sam_local;
  undefined8 local_8;
  
  if ((*sam & 0x8000000000000000) == 0) {
    local_8 = *sam | 0x8000000000000000;
  }
  else {
    local_8 = (*sam ^ 0xffffffffffffffff) + 1;
  }
  return local_8;
}

Assistant:

static Bits SignAndMagnitudeToBiased(const Bits &sam) {
    if (kSignBitMask & sam) {
      // sam represents a negative number.
      return ~sam + 1;
    } else {
      // sam represents a positive number.
      return kSignBitMask | sam;
    }
  }